

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex_interface.cpp
# Opt level: O0

void SoPlex_getLowerReal(void *soplex,double *lb,int dim)

{
  int in_EDX;
  Settings *in_RSI;
  int i;
  Vector lbvec;
  SoPlex *so;
  VectorBase<double> *in_stack_ffffffffffffffa8;
  SoPlexBase<double> *this;
  int local_48;
  int in_stack_ffffffffffffffbc;
  VectorBase<double> *in_stack_ffffffffffffffc0;
  int local_14;
  Settings *local_10;
  
  this = (SoPlexBase<double> *)&stack0xffffffffffffffc8;
  local_14 = in_EDX;
  local_10 = in_RSI;
  ::soplex::VectorBase<double>::VectorBase(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  ::soplex::SoPlexBase<double>::getLowerReal(this,in_stack_ffffffffffffffa8);
  for (local_48 = 0; local_48 < local_14; local_48 = local_48 + 1) {
    in_stack_ffffffffffffffa8 =
         (VectorBase<double> *)
         ::soplex::VectorBase<double>::operator[]
                   ((VectorBase<double> *)this,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    *(pointer *)(local_10->_boolParamValues + (long)local_48 * 8) =
         (in_stack_ffffffffffffffa8->val).super__Vector_base<double,_std::allocator<double>_>.
         _M_impl.super__Vector_impl_data._M_start;
  }
  ::soplex::VectorBase<double>::~VectorBase((VectorBase<double> *)0x1a68be);
  return;
}

Assistant:

void SoPlex_getLowerReal(void* soplex, double* lb, int dim)
{
   SoPlex* so = (SoPlex*)(soplex);
   Vector lbvec(dim);

   so->getLowerReal(lbvec);

   for(int i = 0; i < dim; ++i)
      lb[i] = lbvec[i];
}